

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArenaAllocator.cpp
# Opt level: O0

void * Memory::InPlaceFreeListPolicy::New
                 (ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *allocator)

{
  bool bVar1;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar2;
  TrackAllocData local_78;
  code *local_50;
  undefined8 local_48;
  TrackAllocData local_40;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *local_18;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *allocator_local;
  
  local_18 = allocator;
  bVar1 = ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::HasDelayFreeList
                    (allocator);
  pAVar2 = local_18;
  if (bVar1) {
    TrackAllocData::CreateTrackAllocData
              (&local_40,(type_info *)&FreeObject*::typeinfo,0,0x80,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/ArenaAllocator.cpp"
               ,0x302);
    pAVar2 = ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::TrackAllocInfo
                       (pAVar2,&local_40);
    local_50 = ArenaAllocator::NoThrowNoRecoveryAllocZero;
    local_48 = 0;
    allocator_local =
         (ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
         AllocateArray<Memory::ArenaAllocator,Memory::InPlaceFreeListPolicy::FreeObject*,true>
                   ((Memory *)pAVar2,(ArenaAllocator *)ArenaAllocator::NoThrowNoRecoveryAllocZero,0,
                    0x80);
  }
  else {
    TrackAllocData::CreateTrackAllocData
              (&local_78,(type_info *)&FreeObject*::typeinfo,0,0x40,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/ArenaAllocator.cpp"
               ,0x305);
    pAVar2 = ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::TrackAllocInfo
                       (pAVar2,&local_78);
    allocator_local =
         (ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
         AllocateArray<Memory::ArenaAllocator,Memory::InPlaceFreeListPolicy::FreeObject*,true>
                   ((Memory *)pAVar2,(ArenaAllocator *)ArenaAllocator::NoThrowNoRecoveryAllocZero,0,
                    0x40);
  }
  return allocator_local;
}

Assistant:

void * InPlaceFreeListPolicy::New(ArenaAllocatorBase<InPlaceFreeListPolicy> * allocator)
{
#if DBG
    // Allocate freeList followed by delayFreeList
    // A delayFreeList will enable us to detect use-after free scenarios in debug builds
    if (allocator->HasDelayFreeList())
    {
        return AllocatorNewNoThrowNoRecoveryArrayZ(ArenaAllocator, allocator, FreeObject *, 2 * buckets);
    }
#endif
    return AllocatorNewNoThrowNoRecoveryArrayZ(ArenaAllocator, allocator, FreeObject *, buckets);
}